

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall
Js::ParseableFunctionInfo::ParseableFunctionInfo
          (ParseableFunctionInfo *this,JavascriptMethod entryPoint,int nestedCount,
          LocalFunctionId functionId,Utf8SourceInfo *sourceInfo,ScriptContext *scriptContext,
          uint functionNumber,char16 *displayName,uint displayNameLength,uint displayShortNameOffset
          ,Attributes attributes,FunctionBodyFlags flags)

{
  Recycler *pRVar1;
  FunctionInfo *this_00;
  NestedArray *ptr;
  FunctionEntryPointInfo *this_01;
  undefined1 local_70 [8];
  TrackAllocData data;
  
  FunctionProxy::FunctionProxy(&this->super_FunctionProxy,scriptContext,sourceInfo,functionNumber);
  (this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_013771d0;
  *(ushort *)&(this->super_FunctionProxy).field_0x45 =
       *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x888 | 0x6041;
  (this->super_FunctionProxy).field_0x47 = 4;
  this->flags = flags;
  this->m_grfscr = 0;
  this->m_inParamCount = 0;
  this->m_reportedInParamCount = 0;
  this->m_cchStartOffset = 0;
  this->m_cchLength = 0;
  this->m_cbLength = 0;
  this->m_displayShortNameOffset = 0;
  this->scopeSlotArraySize = 0;
  this->paramScopeSlotArraySize = 0;
  this->m_sourceIndex = 0xffffffff;
  (this->m_displayName).ptr = (char16_t *)0x0;
  this->m_displayNameLength = 0;
  (this->nestedArray).ptr = (NestedArray *)0x0;
  this->scopeObjectSize = 0;
  this->m_dynamicInterpreterThunk = (Type)0x0;
  (this->crossSiteDeferredFunctionType).ptr = (ScriptFunctionType *)0x0;
  this->m_columnNumber = 0;
  (this->crossSiteUndeferredFunctionType).ptr = (ScriptFunctionType *)0x0;
  this->m_cbStartOffset = 0;
  this->m_lineNumber = 0;
  local_70 = (undefined1  [8])&FunctionInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0x690;
  pRVar1 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_70);
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar1,0x37a1d4);
  data._32_8_ = entryPoint;
  FunctionInfo::FunctionInfo(this_00,entryPoint,attributes,functionId,&this->super_FunctionProxy);
  Memory::WriteBarrierPtr<Js::FunctionInfo>::WriteBarrierSet
            (&(this->super_FunctionProxy).functionInfo,this_00);
  if (nestedCount < 1) {
    (this->nestedArray).ptr = (NestedArray *)0x0;
  }
  else {
    data.typeinfo = (type_info *)((ulong)(uint)nestedCount << 3);
    local_70 = (undefined1  [8])&NestedArray::typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x695;
    pRVar1 = Memory::Recycler::TrackAllocInfo
                       (((this->super_FunctionProxy).m_scriptContext)->recycler,
                        (TrackAllocData *)local_70);
    ptr = (NestedArray *)new<Memory::Recycler>(8,pRVar1,0x398e98,0);
    ptr->nestedCount = nestedCount;
    Memory::WriteBarrierPtr<Js::ParseableFunctionInfo::NestedArray>::WriteBarrierSet
              (&this->nestedArray,ptr);
  }
  if ((attributes & DeferredParse) == None) {
    local_70 = (undefined1  [8])&FunctionEntryPointInfo::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x69f;
    pRVar1 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_70);
    this_01 = (FunctionEntryPointInfo *)new<Memory::Recycler>(0x88,pRVar1,0x391482);
    FunctionEntryPointInfo::FunctionEntryPointInfo
              (this_01,&this->super_FunctionProxy,(JavascriptMethod)data._32_8_,
               scriptContext->threadContext);
  }
  else {
    local_70 = (undefined1  [8])&ProxyEntryPointInfo::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_29f156b;
    data.filename._0_4_ = 0x6a3;
    pRVar1 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_70);
    this_01 = (FunctionEntryPointInfo *)new<Memory::Recycler>(0x18,pRVar1,0x37a1d4);
    ProxyEntryPointInfo::ProxyEntryPointInfo
              ((ProxyEntryPointInfo *)this_01,(JavascriptMethod)data._32_8_,(ThreadContext *)0x0);
  }
  Memory::WriteBarrierPtr<Js::ProxyEntryPointInfo>::WriteBarrierSet
            (&(this->super_FunctionProxy).m_defaultEntryPointInfo,(ProxyEntryPointInfo *)this_01);
  (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[6])
            (this,displayName,(ulong)displayNameLength,(ulong)displayShortNameOffset,0);
  FunctionProxy::SetOriginalEntryPoint
            (&this->super_FunctionProxy,InterpreterStackFrame::DelayDynamicInterpreterThunk);
  return;
}

Assistant:

ParseableFunctionInfo::ParseableFunctionInfo(JavascriptMethod entryPoint, int nestedCount,
        LocalFunctionId functionId, Utf8SourceInfo* sourceInfo, ScriptContext* scriptContext, uint functionNumber,
        const char16* displayName, uint displayNameLength, uint displayShortNameOffset, FunctionInfo::Attributes attributes, FunctionBodyFlags flags) :
      FunctionProxy(scriptContext, sourceInfo, functionNumber),
      crossSiteDeferredFunctionType(nullptr),
      crossSiteUndeferredFunctionType(nullptr),
#if DYNAMIC_INTERPRETER_THUNK
      m_dynamicInterpreterThunk(nullptr),
#endif
      flags(flags),
      m_hasBeenParsed(false),
      m_isGlobalFunc(false),
      m_isDeclaration(false),
      m_isNamedFunctionExpression(false),
      m_isNameIdentifierRef (true),
      m_isStaticNameFunction(false),
      m_doBackendArgumentsOptimization(true),
      m_doScopeObjectCreation(true),
      m_usesArgumentsObject(false),
      m_isStrictMode(false),
      m_isAsmjsMode(false),
      m_dontInline(false),
      m_hasImplicitArgIns(true),
      m_grfscr(0),
      m_inParamCount(0),
      m_reportedInParamCount(0),
      m_sourceIndex(Js::Constants::InvalidSourceIndex),
      m_utf8SourceHasBeenSet(false),
      m_cchLength(0),
      m_cbLength(0),
      m_cchStartOffset(0),
      m_cbStartOffset(0),
      m_lineNumber(0),
      m_columnNumber(0),
      m_isEval(false),
      m_isDynamicFunction(false),
      m_displayName(nullptr),
      m_displayNameLength(0),
      m_displayShortNameOffset(0),
      scopeSlotArraySize(0),
      paramScopeSlotArraySize(0),
      m_reparsed(false),
      m_isAsmJsFunction(false),
      m_tag21(true),
      m_isMethod(false)
#if DBG
      ,m_wasEverAsmjsMode(false)
      ,scopeObjectSize(0)
#endif
    {
        this->functionInfo = RecyclerNew(scriptContext->GetRecycler(), FunctionInfo, entryPoint, attributes, functionId, this);

        if (nestedCount > 0)
        {
            nestedArray = RecyclerNewPlusZ(m_scriptContext->GetRecycler(),
                nestedCount*sizeof(FunctionProxy*), NestedArray, nestedCount);
        }
        else
        {
            nestedArray = nullptr;
        }

        if ((attributes & Js::FunctionInfo::DeferredParse) == 0)
        {
            this->m_defaultEntryPointInfo = RecyclerNewFinalized(scriptContext->GetRecycler(),
                FunctionEntryPointInfo, this, entryPoint, scriptContext->GetThreadContext());
        }
        else
        {
            this->m_defaultEntryPointInfo = RecyclerNew(scriptContext->GetRecycler(), ProxyEntryPointInfo, entryPoint);
        }

        SetDisplayName(displayName, displayNameLength, displayShortNameOffset);
        this->SetOriginalEntryPoint(DefaultEntryThunk);
    }